

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O0

aiMaterial *
ImportMaterial(vector<int,_std::allocator<int>_> *embeddedTexIdxs,Asset *r,Material *mat)

{
  TextureInfo *pTVar1;
  aiMaterial *this;
  ulong uVar2;
  float local_8b4;
  Nullable<glTF2::PbrSpecularGlossiness> *pNStack_8b0;
  float glossinessAsShininess;
  PbrSpecularGlossiness *pbrSG;
  aiString alphaMode;
  float local_484;
  vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *pvStack_480;
  float roughnessAsShininess;
  undefined8 local_478;
  undefined8 local_470;
  vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *local_468;
  undefined8 local_460;
  undefined8 local_458;
  vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *local_450;
  undefined8 local_448;
  undefined8 local_440;
  undefined1 local_438 [8];
  aiString str;
  aiMaterial *aimat;
  Material *mat_local;
  Asset *r_local;
  vector<int,_std::allocator<int>_> *embeddedTexIdxs_local;
  
  this = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    aiString::aiString((aiString *)local_438,&(mat->super_Object).name);
    aiMaterial::AddProperty(this,(aiString *)local_438,"?mat.name",0,0);
  }
  SetMaterialColorProperty(r,(mat->pbrMetallicRoughness).baseColorFactor,this,"$clr.diffuse",0,0);
  SetMaterialColorProperty
            (r,(mat->pbrMetallicRoughness).baseColorFactor,this,
             "$mat.gltf.pbrMetallicRoughness.baseColorFactor",0,0);
  pTVar1 = &(mat->pbrMetallicRoughness).baseColorTexture;
  local_450 = (pTVar1->texture).vector;
  local_448 = *(undefined8 *)&(mat->pbrMetallicRoughness).baseColorTexture.texture.index;
  local_440._0_4_ = (mat->pbrMetallicRoughness).baseColorTexture.index;
  local_440._4_4_ = (mat->pbrMetallicRoughness).baseColorTexture.texCoord;
  SetMaterialTextureProperty(embeddedTexIdxs,r,*pTVar1,this,aiTextureType_DIFFUSE,0);
  pTVar1 = &(mat->pbrMetallicRoughness).baseColorTexture;
  local_468 = (pTVar1->texture).vector;
  local_460 = *(undefined8 *)&(mat->pbrMetallicRoughness).baseColorTexture.texture.index;
  local_458._0_4_ = (mat->pbrMetallicRoughness).baseColorTexture.index;
  local_458._4_4_ = (mat->pbrMetallicRoughness).baseColorTexture.texCoord;
  SetMaterialTextureProperty(embeddedTexIdxs,r,*pTVar1,this,aiTextureType_DIFFUSE,1);
  pTVar1 = &(mat->pbrMetallicRoughness).metallicRoughnessTexture;
  pvStack_480 = (pTVar1->texture).vector;
  local_478 = *(undefined8 *)&(mat->pbrMetallicRoughness).metallicRoughnessTexture.texture.index;
  local_470._0_4_ = (mat->pbrMetallicRoughness).metallicRoughnessTexture.index;
  local_470._4_4_ = (mat->pbrMetallicRoughness).metallicRoughnessTexture.texCoord;
  SetMaterialTextureProperty(embeddedTexIdxs,r,*pTVar1,this,aiTextureType_UNKNOWN,0);
  aiMaterial::AddProperty
            (this,&(mat->pbrMetallicRoughness).metallicFactor,1,
             "$mat.gltf.pbrMetallicRoughness.metallicFactor",0,0);
  aiMaterial::AddProperty
            (this,&(mat->pbrMetallicRoughness).roughnessFactor,1,
             "$mat.gltf.pbrMetallicRoughness.roughnessFactor",0,0);
  local_484 = 1.0 - (mat->pbrMetallicRoughness).roughnessFactor;
  local_484 = local_484 * 1000.0 * local_484;
  aiMaterial::AddProperty(this,&local_484,1,"$mat.shininess",0,0);
  SetMaterialTextureProperty(embeddedTexIdxs,r,&mat->normalTexture,this,aiTextureType_NORMALS,0);
  SetMaterialTextureProperty(embeddedTexIdxs,r,&mat->occlusionTexture,this,aiTextureType_LIGHTMAP,0)
  ;
  alphaMode.data._1016_8_ = (mat->emissiveTexture).texture.vector;
  SetMaterialTextureProperty(embeddedTexIdxs,r,mat->emissiveTexture,this,aiTextureType_EMISSIVE,0);
  SetMaterialColorProperty(r,&mat->emissiveFactor,this,"$clr.emissive",0,0);
  aiMaterial::AddProperty<bool>(this,&mat->doubleSided,1,"$mat.twosided",0,0);
  aiString::aiString((aiString *)((long)&pbrSG + 4),&mat->alphaMode);
  aiMaterial::AddProperty(this,(aiString *)((long)&pbrSG + 4),"$mat.gltf.alphaMode",0,0);
  aiMaterial::AddProperty(this,&mat->alphaCutoff,1,"$mat.gltf.alphaCutoff",0,0);
  if (((mat->pbrSpecularGlossiness).isPresent & 1U) != 0) {
    pNStack_8b0 = &mat->pbrSpecularGlossiness;
    aiMaterial::AddProperty<bool>
              (this,&(mat->pbrSpecularGlossiness).isPresent,1,"$mat.gltf.pbrSpecularGlossiness",0,0)
    ;
    SetMaterialColorProperty(r,(vec4 *)pNStack_8b0,this,"$clr.diffuse",0,0);
    SetMaterialColorProperty(r,&(pNStack_8b0->value).specularFactor,this,"$clr.specular",0,0);
    local_8b4 = (pNStack_8b0->value).glossinessFactor * 1000.0;
    aiMaterial::AddProperty(this,&local_8b4,1,"$mat.shininess",0,0);
    aiMaterial::AddProperty
              (this,&(pNStack_8b0->value).glossinessFactor,1,
               "$mat.gltf.pbrMetallicRoughness.glossinessFactor",0,0);
    SetMaterialTextureProperty
              (embeddedTexIdxs,r,(pNStack_8b0->value).diffuseTexture,this,aiTextureType_DIFFUSE,0);
    SetMaterialTextureProperty
              (embeddedTexIdxs,r,(pNStack_8b0->value).specularGlossinessTexture,this,
               aiTextureType_SPECULAR,0);
  }
  if ((mat->unlit & 1U) != 0) {
    aiMaterial::AddProperty<bool>(this,&mat->unlit,1,"$mat.gltf.unlit",0,0);
  }
  return this;
}

Assistant:

static aiMaterial* ImportMaterial(std::vector<int>& embeddedTexIdxs, Asset& r, Material& mat)
{
    aiMaterial* aimat = new aiMaterial();

   if (!mat.name.empty()) {
        aiString str(mat.name);

        aimat->AddProperty(&str, AI_MATKEY_NAME);
    }

    SetMaterialColorProperty(r, mat.pbrMetallicRoughness.baseColorFactor, aimat, AI_MATKEY_COLOR_DIFFUSE);
    SetMaterialColorProperty(r, mat.pbrMetallicRoughness.baseColorFactor, aimat, AI_MATKEY_GLTF_PBRMETALLICROUGHNESS_BASE_COLOR_FACTOR);

    SetMaterialTextureProperty(embeddedTexIdxs, r, mat.pbrMetallicRoughness.baseColorTexture, aimat, aiTextureType_DIFFUSE);
    SetMaterialTextureProperty(embeddedTexIdxs, r, mat.pbrMetallicRoughness.baseColorTexture, aimat, AI_MATKEY_GLTF_PBRMETALLICROUGHNESS_BASE_COLOR_TEXTURE);

    SetMaterialTextureProperty(embeddedTexIdxs, r, mat.pbrMetallicRoughness.metallicRoughnessTexture, aimat, AI_MATKEY_GLTF_PBRMETALLICROUGHNESS_METALLICROUGHNESS_TEXTURE);

    aimat->AddProperty(&mat.pbrMetallicRoughness.metallicFactor, 1, AI_MATKEY_GLTF_PBRMETALLICROUGHNESS_METALLIC_FACTOR);
    aimat->AddProperty(&mat.pbrMetallicRoughness.roughnessFactor, 1, AI_MATKEY_GLTF_PBRMETALLICROUGHNESS_ROUGHNESS_FACTOR);

    float roughnessAsShininess = 1 - mat.pbrMetallicRoughness.roughnessFactor;
    roughnessAsShininess *= roughnessAsShininess * 1000;
    aimat->AddProperty(&roughnessAsShininess, 1, AI_MATKEY_SHININESS);

    SetMaterialTextureProperty(embeddedTexIdxs, r, mat.normalTexture, aimat, aiTextureType_NORMALS);
    SetMaterialTextureProperty(embeddedTexIdxs, r, mat.occlusionTexture, aimat, aiTextureType_LIGHTMAP);
    SetMaterialTextureProperty(embeddedTexIdxs, r, mat.emissiveTexture, aimat, aiTextureType_EMISSIVE);
    SetMaterialColorProperty(r, mat.emissiveFactor, aimat, AI_MATKEY_COLOR_EMISSIVE);

    aimat->AddProperty(&mat.doubleSided, 1, AI_MATKEY_TWOSIDED);

    aiString alphaMode(mat.alphaMode);
    aimat->AddProperty(&alphaMode, AI_MATKEY_GLTF_ALPHAMODE);
    aimat->AddProperty(&mat.alphaCutoff, 1, AI_MATKEY_GLTF_ALPHACUTOFF);

    //pbrSpecularGlossiness
    if (mat.pbrSpecularGlossiness.isPresent) {
        PbrSpecularGlossiness &pbrSG = mat.pbrSpecularGlossiness.value;

        aimat->AddProperty(&mat.pbrSpecularGlossiness.isPresent, 1, AI_MATKEY_GLTF_PBRSPECULARGLOSSINESS);
        SetMaterialColorProperty(r, pbrSG.diffuseFactor, aimat, AI_MATKEY_COLOR_DIFFUSE);
        SetMaterialColorProperty(r, pbrSG.specularFactor, aimat, AI_MATKEY_COLOR_SPECULAR);

        float glossinessAsShininess = pbrSG.glossinessFactor * 1000.0f;
        aimat->AddProperty(&glossinessAsShininess, 1, AI_MATKEY_SHININESS);
        aimat->AddProperty(&pbrSG.glossinessFactor, 1, AI_MATKEY_GLTF_PBRSPECULARGLOSSINESS_GLOSSINESS_FACTOR);

        SetMaterialTextureProperty(embeddedTexIdxs, r, pbrSG.diffuseTexture, aimat, aiTextureType_DIFFUSE);

        SetMaterialTextureProperty(embeddedTexIdxs, r, pbrSG.specularGlossinessTexture, aimat, aiTextureType_SPECULAR);
    }
    if (mat.unlit) {
        aimat->AddProperty(&mat.unlit, 1, AI_MATKEY_GLTF_UNLIT);
    }

    return aimat;
}